

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void conditional_EBNF(Grammar *g)

{
  uint uVar1;
  Production *p;
  Rule *pRVar2;
  Elem *pEVar3;
  Rule *rr;
  Production *pp;
  Grammar *g_local;
  
  p = new_internal_production(g,g->p);
  p->field_0x3c = p->field_0x3c & 0xe3 | 8;
  pRVar2 = new_rule(g,p);
  if ((pRVar2->elems).v == (Elem **)0x0) {
    pEVar3 = (g->r->elems).v[(g->r->elems).n - 1];
    (pRVar2->elems).v = (pRVar2->elems).e;
    uVar1 = (pRVar2->elems).n;
    (pRVar2->elems).n = uVar1 + 1;
    (pRVar2->elems).e[uVar1] = pEVar3;
  }
  else if ((pRVar2->elems).v == (pRVar2->elems).e) {
    if ((pRVar2->elems).n < 3) {
      pEVar3 = (g->r->elems).v[(g->r->elems).n - 1];
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = pEVar3;
    }
    else {
LAB_0013f82d:
      vec_add_internal(&pRVar2->elems,(g->r->elems).v[(g->r->elems).n - 1]);
    }
  }
  else {
    if (((pRVar2->elems).n & 7) == 0) goto LAB_0013f82d;
    pEVar3 = (g->r->elems).v[(g->r->elems).n - 1];
    uVar1 = (pRVar2->elems).n;
    (pRVar2->elems).n = uVar1 + 1;
    (pRVar2->elems).v[uVar1] = pEVar3;
  }
  (g->r->elems).v[(g->r->elems).n - 1]->rule = pRVar2;
  (pRVar2->elems).v[(pRVar2->elems).n - 1]->rule = pRVar2;
  if ((p->rules).v == (Rule **)0x0) {
    (p->rules).v = (p->rules).e;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar2;
  }
  else if ((p->rules).v == (p->rules).e) {
    if ((p->rules).n < 3) {
      uVar1 = (p->rules).n;
      (p->rules).n = uVar1 + 1;
      (p->rules).v[uVar1] = pRVar2;
    }
    else {
LAB_0013f96d:
      vec_add_internal(&p->rules,pRVar2);
    }
  }
  else {
    if (((p->rules).n & 7) == 0) goto LAB_0013f96d;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).v[uVar1] = pRVar2;
  }
  if ((p->rules).v == (Rule **)0x0) {
    pRVar2 = new_rule(g,p);
    (p->rules).v = (p->rules).e;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar2;
  }
  else {
    if ((p->rules).v == (p->rules).e) {
      if ((p->rules).n < 3) {
        pRVar2 = new_rule(g,p);
        uVar1 = (p->rules).n;
        (p->rules).n = uVar1 + 1;
        (p->rules).v[uVar1] = pRVar2;
        goto LAB_0013fa88;
      }
    }
    else if (((p->rules).n & 7) != 0) {
      pRVar2 = new_rule(g,p);
      uVar1 = (p->rules).n;
      (p->rules).n = uVar1 + 1;
      (p->rules).v[uVar1] = pRVar2;
      goto LAB_0013fa88;
    }
    pRVar2 = new_rule(g,p);
    vec_add_internal(&p->rules,pRVar2);
  }
LAB_0013fa88:
  pEVar3 = new_elem_nterm(p,g->r);
  (g->r->elems).v[(g->r->elems).n - 1] = pEVar3;
  return;
}

Assistant:

void conditional_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_CONDITIONAL;
  rr = new_rule(g, pp);
  vec_add(&rr->elems, last_elem(g->r));
  last_elem(g->r)->rule = rr;
  rr->elems.v[rr->elems.n - 1]->rule = rr;
  vec_add(&pp->rules, rr);
  vec_add(&pp->rules, new_rule(g, pp));
  last_elem(g->r) = new_elem_nterm(pp, g->r);
}